

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

bool __thiscall BenevolentBotStrategy::canFortify(BenevolentBotStrategy *this)

{
  int iVar1;
  int iVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  Country *pCVar4;
  Country *pCVar5;
  bool bVar6;
  Country *pCVar7;
  pointer ppCVar8;
  pointer ppCVar9;
  
  pvVar3 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  pCVar7 = (Country *)0x0;
  bVar6 = false;
  for (ppCVar8 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppCVar8 !=
      (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
    pCVar4 = *ppCVar8;
    pCVar5 = pCVar4;
    if ((pCVar7 != (Country *)0x0) &&
       (iVar1 = *pCVar4->pNumberOfTroops, pCVar5 = pCVar7, iVar1 < *pCVar7->pNumberOfTroops)) {
      for (ppCVar9 = (pCVar4->pAdjCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start; pCVar5 = pCVar7,
          ppCVar9 !=
          (pCVar4->pAdjCountries->
          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
          super__Vector_impl_data._M_finish; ppCVar9 = ppCVar9 + 1) {
        if (*(*ppCVar9)->pPlayerOwnerId == *pCVar4->pPlayerOwnerId) {
          iVar2 = *(*ppCVar9)->pNumberOfTroops;
          if (iVar1 < iVar2) {
            pCVar7 = pCVar4;
          }
          bVar6 = (bool)(bVar6 | iVar1 < iVar2);
        }
      }
    }
    pCVar7 = pCVar5;
  }
  for (ppCVar8 = (pCVar7->pAdjCountries->
                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar8 !=
      (pCVar7->pAdjCountries->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
      _M_impl.super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
    if (*(*ppCVar8)->pPlayerOwnerId == *pCVar7->pPlayerOwnerId) {
      bVar6 = (bool)(bVar6 | *pCVar7->pNumberOfTroops < *(*ppCVar8)->pNumberOfTroops);
    }
  }
  return bVar6;
}

Assistant:

bool BenevolentBotStrategy::canFortify() {
    bool canFortify = false;
    Map::Country* smallestCountry = nullptr;

    for (auto* country: *player->getOwnedCountries()) {
        if (smallestCountry == nullptr) {
            smallestCountry = country;
        } else if (smallestCountry->getNumberOfTroops() > country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() == country->getPlayerOwnerID()
                    && neighbour->getNumberOfTroops() > country->getNumberOfTroops()) {
                    smallestCountry = country;
                    canFortify = true;
                }
            }
        }
    }

    for (auto* neighbour : *smallestCountry->getAdjCountries()) {
        if (neighbour->getPlayerOwnerID() == smallestCountry->getPlayerOwnerID()
                && neighbour->getNumberOfTroops() > smallestCountry->getNumberOfTroops()) {
            canFortify = true;
        }
    }
    return canFortify;
}